

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_no_delay(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>
                    *this,bool b,error_code *ec)

{
  undefined7 in_register_00000031;
  error_code eVar1;
  boolean<6,_1> local_c;
  
  local_c.value_ = (int)CONCAT71(in_register_00000031,b);
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  set_option<asio::detail::socket_option::boolean<6,1>>
            ((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_
             ,&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
               implementation_,&local_c,ec);
  eVar1._4_4_ = 0;
  eVar1._M_value = ec->_M_value;
  eVar1._M_cat = ec->_M_cat;
  return eVar1;
}

Assistant:

std::error_code set_option_no_delay(bool b, std::error_code& ec)
    {
        return set_option(asio::ip::tcp::no_delay(b), ec);
    }